

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O1

string * __thiscall
pbrt::SpectrumMixTexture::ToString_abi_cxx11_
          (string *__return_storage_ptr__,SpectrumMixTexture *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pbrt::SpectrumTextureHandle_const&,pbrt::SpectrumTextureHandle_const&,pbrt::FloatTextureHandle_const&>
            (__return_storage_ptr__,"[ SpectrumMixTexture tex1: %s tex2: %s amount: %s ]",
             &this->tex1,&this->tex2,&this->amount);
  return __return_storage_ptr__;
}

Assistant:

std::string SpectrumMixTexture::ToString() const {
    return StringPrintf("[ SpectrumMixTexture tex1: %s tex2: %s amount: %s ]", tex1, tex2,
                        amount);
}